

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O1

void CServerBrowserFavorites::ConfigSaveCallback(IConfigManager *pConfigManager,void *pUserData)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char aBuffer [320];
  char acStack_178 [320];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < *(int *)((long)pUserData + 0xbc00)) {
    pcVar2 = (char *)((long)pUserData + 0x80);
    lVar1 = 0;
    do {
      if (*pcVar2 == '\0') {
        str_format(acStack_178,0x140,"add_favorite \"%s\"",pcVar2 + -0x80);
      }
      else {
        str_format(acStack_178,0x140,"add_favorite \"%s\" \"%s\"",pcVar2 + -0x80,pcVar2);
      }
      (*(pConfigManager->super_IInterface)._vptr_IInterface[8])(pConfigManager,acStack_178);
      lVar1 = lVar1 + 1;
      pcVar2 = pcVar2 + 0xbc;
    } while (lVar1 < *(int *)((long)pUserData + 0xbc00));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServerBrowserFavorites::ConfigSaveCallback(IConfigManager *pConfigManager, void *pUserData)
{
	CServerBrowserFavorites *pSelf = (CServerBrowserFavorites *)pUserData;

	char aBuffer[320];
	for(int i = 0; i < pSelf->m_NumFavoriteServers; i++)
	{
		if(pSelf->m_aFavoriteServers[i].m_aPassword[0])
			str_format(aBuffer, sizeof(aBuffer), "add_favorite \"%s\" \"%s\"", pSelf->m_aFavoriteServers[i].m_aHostname, pSelf->m_aFavoriteServers[i].m_aPassword);
		else
			str_format(aBuffer, sizeof(aBuffer), "add_favorite \"%s\"", pSelf->m_aFavoriteServers[i].m_aHostname);
		pConfigManager->WriteLine(aBuffer);
	}
}